

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O3

Value __thiscall Json::Value::removeMember(Value *this,char *key)

{
  iterator __position;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar1;
  Value VVar2;
  CZString actualKey;
  key_type local_28;
  
  if (key[8] == '\0') {
    Value(this,(Value *)null);
    uVar1 = extraout_RDX;
  }
  else {
    if (key[8] != '\a') {
      __assert_fail("type_ == nullValue || type_ == objectValue",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/jbcoin/json/impl/json_value.cpp"
                    ,0x3d0,"Value Json::Value::removeMember(const char *)");
    }
    local_28.index_ = 0;
    __position = std::
                 _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
                 ::find(*(_Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
                          **)key,&local_28);
    if (__position._M_node == (_Base_ptr)(*(long *)key + 8)) {
      Value(this,(Value *)null);
    }
    else {
      Value(this,(Value *)&__position._M_node[1]._M_left);
      std::
      _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
      ::_M_erase_aux(*(_Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
                       **)key,(const_iterator)__position._M_node);
    }
    CZString::~CZString(&local_28);
    uVar1 = extraout_RDX_00;
  }
  VVar2._8_8_ = uVar1;
  VVar2.value_.map_ = (ObjectValues *)this;
  return VVar2;
}

Assistant:

Value
Value::removeMember ( const char* key )
{
    JSON_ASSERT ( type_ == nullValue  ||  type_ == objectValue );

    if ( type_ == nullValue )
        return null;

    CZString actualKey ( key, CZString::noDuplication );
    ObjectValues::iterator it = value_.map_->find ( actualKey );

    if ( it == value_.map_->end () )
        return null;

    Value old (it->second);
    value_.map_->erase (it);
    return old;
}